

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O3

bool __thiscall quadtree::Box<float>::intersects(Box<float> *this,Box<float> *box)

{
  if ((this->left < box->width + box->left) && (box->left < this->left + this->width)) {
    if (this->top < box->height + box->top) {
      return box->top < this->top + this->height;
    }
  }
  return false;
}

Assistant:

constexpr bool intersects(const Box<T>& box) const noexcept
    {
        return !(left >= box.getRight() || getRight() <= box.left ||
            top >= box.getBottom() || getBottom() <= box.top);
    }